

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moderation.cpp
# Opt level: O2

void Commands::do_punishment
               (Command_Source *from,Character *victim,
               function<void_(World_*,_Command_Source_*,_Character_*,_bool)> *f,bool announce)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  string *this;
  allocator<char> local_91;
  string local_90;
  string local_70;
  string local_50;
  World *__args;
  
  iVar1 = (*from->_vptr_Command_Source[4])();
  __args = (World *)CONCAT44(extraout_var,iVar1);
  if ((victim == (Character *)0x0) || (victim->nowhere == true)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"character_not_found",&local_91);
    I18N::Format<>(&local_50,&__args->i18n,&local_90);
    (*from->_vptr_Command_Source[5])(from,&local_50);
    this = &local_50;
  }
  else {
    iVar1 = (**(victim->super_Command_Source)._vptr_Command_Source)(victim);
    iVar2 = (**from->_vptr_Command_Source)(from);
    if ((byte)iVar1 < (byte)iVar2) {
      std::function<void_(World_*,_Command_Source_*,_Character_*,_bool)>::operator()
                (f,__args,from,victim,announce);
      return;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"command_access_denied",&local_91);
    I18N::Format<>(&local_70,&__args->i18n,&local_90);
    (*from->_vptr_Command_Source[5])(from,&local_70);
    this = &local_70;
  }
  std::__cxx11::string::~string((string *)this);
  std::__cxx11::string::~string((string *)&local_90);
  return;
}

Assistant:

static void do_punishment(Command_Source* from, Character* victim, std::function<void(World*, Command_Source*, Character*, bool)> f, bool announce)
{
	World* world = from->SourceWorld();

	if (!victim || victim->nowhere)
	{
		from->ServerMsg(world->i18n.Format("character_not_found"));
	}
	else
	{
		if (victim->SourceAccess() < from->SourceAccess())
		{
			f(world, from, victim, announce);
		}
		else
		{
			from->ServerMsg(world->i18n.Format("command_access_denied"));
		}
	}
}